

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noproxy.c
# Opt level: O2

_Bool Curl_check_noproxy(char *name,char *no_proxy,_Bool *spacesep)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  char cVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  size_t __n;
  ulong max;
  long lVar9;
  byte *pbVar10;
  uint uVar11;
  size_t sVar12;
  long lVar13;
  byte *pbVar14;
  bool bVar15;
  char *local_178;
  size_t local_170;
  uint local_168 [4];
  uchar address_1 [16];
  char checkip [128];
  char hostip [128];
  
  *spacesep = false;
  if (name == (char *)0x0) {
    return false;
  }
  if (no_proxy == (char *)0x0 || *name == '\0') {
    return false;
  }
  if (*no_proxy == 0) {
    return false;
  }
  uVar7 = (byte)*no_proxy - 0x2a;
  if (uVar7 == 0) {
    uVar7 = (uint)(byte)no_proxy[1];
  }
  if (uVar7 == 0) {
    return true;
  }
  if (*name == '[') {
    pcVar4 = strchr(name,0x5d);
    if (pcVar4 == (char *)0x0) {
      return false;
    }
    local_170 = (long)pcVar4 - (long)(name + 1);
    if (0x7f < local_170) {
      return false;
    }
    cVar5 = '\x02';
    local_178 = hostip;
    memcpy(local_178,name + 1,local_170);
    hostip[local_170] = '\0';
  }
  else {
    local_170 = strlen(name);
    iVar3 = inet_pton(2,name,hostip);
    if (iVar3 != 1) {
      local_170 = local_170 - (name[local_170 - 1] == '.');
    }
    cVar5 = iVar3 == 1;
    local_178 = name;
  }
  do {
    sVar12 = 0xffffffffffffffff;
    bVar2 = *no_proxy;
    bVar1 = bVar2 != 0;
    if (bVar2 == 0) {
      return false;
    }
    pbVar14 = (byte *)no_proxy + -1;
    while ((bVar2 == 9 || (bVar2 == 0x20))) {
      pbVar10 = (byte *)no_proxy + 1;
      no_proxy = (char *)((byte *)no_proxy + 1);
      pbVar14 = pbVar14 + 1;
      bVar2 = *pbVar10;
    }
    lVar13 = 0;
    bVar6 = bVar2;
    while ((0x2c < bVar6 || ((0x100100000201U >> ((ulong)bVar6 & 0x3f) & 1) == 0))) {
      bVar6 = ((byte *)no_proxy)[sVar12 + 2];
      lVar13 = lVar13 + -1;
      sVar12 = sVar12 + 1;
      pbVar14 = pbVar14 + 1;
    }
    if (lVar13 != 0) {
      __n = -lVar13;
      if (cVar5 == '\0') {
        if (((byte *)no_proxy)[sVar12] == 0x2e) {
          __n = sVar12;
        }
        pbVar10 = (byte *)no_proxy;
        if (__n == 0) {
          __n = 0;
        }
        else if (bVar2 == 0x2e) {
          __n = __n - 1;
          pbVar10 = (byte *)no_proxy + 1;
        }
        lVar9 = local_170 - __n;
        max = local_170;
        pcVar4 = local_178;
        if (lVar9 != 0) {
          if ((local_170 < __n || lVar9 == 0) || (local_178[lVar9 + -1] != '.')) goto LAB_0052391f;
          max = __n;
          pcVar4 = local_178 + lVar9;
        }
        iVar3 = curl_strnequal((char *)pbVar10,pcVar4,max);
        if (iVar3 != 0) {
          return bVar1;
        }
      }
      else if (__n < 0x80) {
        memcpy(checkip,no_proxy,__n);
        checkip[sVar12 + 1] = '\0';
        pcVar4 = strchr(checkip,0x2f);
        if (pcVar4 == (char *)0x0) {
          if (cVar5 == '\x02') {
LAB_005237bc:
            uVar7 = 0x80;
            goto LAB_005237c1;
          }
          uVar7 = 0;
LAB_005238d3:
          address_1[0] = '\0';
          address_1[1] = '\0';
          address_1[2] = '\0';
          address_1[3] = '\0';
          local_168[0] = 0;
          iVar3 = inet_pton(2,local_178,address_1);
          if ((iVar3 == 1) && (iVar3 = inet_pton(2,checkip,local_168), iVar3 == 1)) {
            if ((uVar7 & 0x1f) == 0) {
              bVar15 = address_1._0_4_ == local_168[0];
            }
            else {
              uVar8 = local_168[0] ^ address_1._0_4_;
              bVar15 = (uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                       uVar8 << 0x18) >> (-(char)uVar7 & 0x1fU) == 0;
            }
            if (bVar15) {
              return bVar1;
            }
          }
        }
        else {
          uVar7 = atoi(pcVar4 + 1);
          *pcVar4 = '\0';
          if (cVar5 == '\x02') {
            if (uVar7 == 0) goto LAB_005237bc;
LAB_005237c1:
            iVar3 = inet_pton(10,local_178,address_1);
            if (((iVar3 == 1) && (iVar3 = inet_pton(10,checkip,local_168), uVar7 < 0x88)) &&
               (iVar3 == 1)) {
              uVar11 = uVar7 >> 3;
              uVar8 = uVar7 & 7;
              if (((uVar11 != 0x10 || uVar8 == 0) &&
                  ((uVar7 < 8 || (iVar3 = bcmp(address_1,local_168,(ulong)uVar11), iVar3 == 0)))) &&
                 ((uVar8 == 0 ||
                  ((byte)((*(byte *)((long)local_168 + (ulong)uVar11) ^ address_1[uVar11]) >>
                         (8U - (char)uVar8 & 0x1f)) != 0)))) {
                return true;
              }
            }
          }
          else {
            address_1[0] = '\0';
            address_1[1] = '\0';
            address_1[2] = '\0';
            address_1[3] = '\0';
            local_168[0] = 0;
            if (uVar7 < 0x21) goto LAB_005238d3;
          }
        }
      }
    }
LAB_0052391f:
    for (no_proxy = (char *)((byte *)no_proxy + -lVar13);
        (bVar2 = *no_proxy, bVar2 == 9 || (bVar2 == 0x20));
        no_proxy = (char *)((byte *)no_proxy + 1)) {
      pbVar14 = pbVar14 + 1;
    }
    if ((bVar2 == 0x2c) || (bVar2 == 0)) {
      do {
        no_proxy = (char *)(pbVar14 + 1);
        pbVar10 = pbVar14 + 1;
        pbVar14 = (byte *)no_proxy;
      } while (*pbVar10 == 0x2c);
    }
    else {
      *spacesep = true;
    }
  } while( true );
}

Assistant:

bool Curl_check_noproxy(const char *name, const char *no_proxy,
                        bool *spacesep)
{
  char hostip[128];
  *spacesep = FALSE;
  /*
   * If we don't have a hostname at all, like for example with a FILE
   * transfer, we have nothing to interrogate the noproxy list with.
   */
  if(!name || name[0] == '\0')
    return FALSE;

  /* no_proxy=domain1.dom,host.domain2.dom
   *   (a comma-separated list of hosts which should
   *   not be proxied, or an asterisk to override
   *   all proxy variables)
   */
  if(no_proxy && no_proxy[0]) {
    const char *p = no_proxy;
    size_t namelen;
    enum nametype type = TYPE_HOST;
    if(!strcmp("*", no_proxy))
      return TRUE;

    /* NO_PROXY was specified and it wasn't just an asterisk */

    if(name[0] == '[') {
      char *endptr;
      /* IPv6 numerical address */
      endptr = strchr(name, ']');
      if(!endptr)
        return FALSE;
      name++;
      namelen = endptr - name;
      if(namelen >= sizeof(hostip))
        return FALSE;
      memcpy(hostip, name, namelen);
      hostip[namelen] = 0;
      name = hostip;
      type = TYPE_IPV6;
    }
    else {
      unsigned int address;
      namelen = strlen(name);
      if(1 == Curl_inet_pton(AF_INET, name, &address))
        type = TYPE_IPV4;
      else {
        /* ignore trailing dots in the host name */
        if(name[namelen - 1] == '.')
          namelen--;
      }
    }

    while(*p) {
      const char *token;
      size_t tokenlen = 0;
      bool match = FALSE;

      /* pass blanks */
      while(*p && ISBLANK(*p))
        p++;

      token = p;
      /* pass over the pattern */
      while(*p && !ISBLANK(*p) && (*p != ',')) {
        p++;
        tokenlen++;
      }

      if(tokenlen) {
        switch(type) {
        case TYPE_HOST:
          /* ignore trailing dots in the token to check */
          if(token[tokenlen - 1] == '.')
            tokenlen--;

          if(tokenlen && (*token == '.')) {
            /* ignore leading token dot as well */
            token++;
            tokenlen--;
          }
          /* A: example.com matches 'example.com'
             B: www.example.com matches 'example.com'
             C: nonexample.com DOES NOT match 'example.com'
          */
          if(tokenlen == namelen)
            /* case A, exact match */
            match = strncasecompare(token, name, namelen);
          else if(tokenlen < namelen) {
            /* case B, tailmatch domain */
            match = (name[namelen - tokenlen - 1] == '.') &&
              strncasecompare(token, name + (namelen - tokenlen),
                              tokenlen);
          }
          /* case C passes through, not a match */
          break;
        case TYPE_IPV4:
        case TYPE_IPV6: {
          const char *check = token;
          char *slash;
          unsigned int bits = 0;
          char checkip[128];
          if(tokenlen >= sizeof(checkip))
            /* this cannot match */
            break;
          /* copy the check name to a temp buffer */
          memcpy(checkip, check, tokenlen);
          checkip[tokenlen] = 0;
          check = checkip;

          slash = strchr(check, '/');
          /* if the slash is part of this token, use it */
          if(slash) {
            bits = atoi(slash + 1);
            *slash = 0; /* null terminate there */
          }
          if(type == TYPE_IPV6)
            match = Curl_cidr6_match(name, check, bits);
          else
            match = Curl_cidr4_match(name, check, bits);
          break;
        }
        }
        if(match)
          return TRUE;
      } /* if(tokenlen) */
      /* pass blanks after pattern */
      while(ISBLANK(*p))
        p++;
      /* if not a comma! */
      if(*p && (*p != ',')) {
        *spacesep = TRUE;
        continue;
      }
      /* pass any number of commas */
      while(*p == ',')
        p++;
    } /* while(*p) */
  } /* NO_PROXY was specified and it wasn't just an asterisk */

  return FALSE;
}